

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PtexReader.cpp
# Opt level: O3

bool __thiscall
Ptex::v2_4::PtexReader::readZipBlock(PtexReader *this,void *data,int zipsize,int unzipsize)

{
  z_stream_s *pzVar1;
  uLong uVar2;
  bool bVar3;
  int iVar4;
  uInt size;
  Bytef aBStack_4038 [16376];
  undefined8 uStack_40;
  undefined8 uStack_38;
  
  uStack_38 = (ulong)(uint)(unzipsize | zipsize);
  if ((unzipsize | zipsize) < 0) {
    return false;
  }
  pzVar1 = &this->_zstream;
  if ((this->_zstream).state == (internal_state *)0x0) {
    uStack_40 = 0x107c0b;
    inflateInit_(pzVar1,"1.2.11",0x70);
  }
  (this->_zstream).next_out = (Bytef *)data;
  uStack_38 = CONCAT44(unzipsize,(undefined4)uStack_38);
  (this->_zstream).avail_out = unzipsize;
  do {
    size = 0x4000;
    if (zipsize < 0x4000) {
      size = zipsize;
    }
    bVar3 = readBlock(this,aBStack_4038,size,true);
    if (!bVar3) goto LAB_00107c7e;
    zipsize = zipsize - size;
    (this->_zstream).next_in = aBStack_4038;
    (this->_zstream).avail_in = size;
    iVar4 = inflate(pzVar1,(ulong)(zipsize == 0) << 2);
  } while (iVar4 == 0);
  if (iVar4 == 1) {
LAB_00107c7e:
    uVar2 = (this->_zstream).total_out;
    inflateReset(pzVar1);
    bVar3 = (int)uVar2 == uStack_38._4_4_;
  }
  else {
    setError(this,"PtexReader error: unzip failed, file corrupt");
    inflateReset(pzVar1);
    bVar3 = false;
  }
  return bVar3;
}

Assistant:

bool PtexReader::readZipBlock(void* data, int zipsize, int unzipsize)
{
    if (zipsize < 0 || unzipsize < 0) return false;
    if (!_zstream.state) {
        inflateInit(&_zstream);
    }

    void* buff = alloca(BlockSize);
    _zstream.next_out = (Bytef*) data;
    _zstream.avail_out = unzipsize;

    while (1) {
        int size = (zipsize < BlockSize) ? zipsize : BlockSize;
        zipsize -= size;
        if (!readBlock(buff, size)) break;
        _zstream.next_in = (Bytef*) buff;
        _zstream.avail_in = size;
        int zresult = inflate(&_zstream, zipsize ? Z_NO_FLUSH : Z_FINISH);
        if (zresult == Z_STREAM_END) break;
        if (zresult != Z_OK) {
            setError("PtexReader error: unzip failed, file corrupt");
            inflateReset(&_zstream);
            return 0;
        }
    }

    int total = (int)_zstream.total_out;
    inflateReset(&_zstream);
    return total == unzipsize;
}